

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.h
# Opt level: O1

node_type * __thiscall
eastl::
hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
::DoAllocateNode(hashtable<eastl::basic_string<char,_eastl::allocator>,_eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator,_eastl::use_first<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>_>,_eastl::equal_to<eastl::basic_string<char,_eastl::allocator>_>,_eastl::hash<eastl::basic_string<char,_eastl::allocator>_>,_eastl::mod_range_hashing,_eastl::default_ranged_hash,_eastl::prime_rehash_policy,_false,_true,_true>
                 *this,value_type *value)

{
  node_type *this_00;
  
  this_00 = (node_type *)malloc(0x48);
  (this_00->mValue).first.mpBegin = (value_type *)0x0;
  (this_00->mValue).first.mpEnd = (value_type *)0x0;
  (this_00->mValue).first.mpCapacity = (value_type *)0x0;
  basic_string<char,_eastl::allocator>::RangeInitialize
            ((basic_string<char,_eastl::allocator> *)this_00,(value->first).mpBegin,
             (value->first).mpEnd);
  (this_00->mValue).second.mpCapacity = (value_type *)0x0;
  (this_00->mValue).second.mpBegin = (value_type *)0x0;
  (this_00->mValue).second.mpEnd = (value_type *)0x0;
  basic_string<char,_eastl::allocator>::RangeInitialize
            (&(this_00->mValue).second,(value->second).mpBegin,(value->second).mpEnd);
  this_00->mpNext =
       (hash_node<eastl::pair<const_eastl::basic_string<char,_eastl::allocator>,_eastl::basic_string<char,_eastl::allocator>_>,_false>
        *)0x0;
  return this_00;
}

Assistant:

typename hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::node_type*
    hashtable<K, V, A, EK, Eq, H1, H2, H, RP, bC, bM, bU>::DoAllocateNode(const value_type& value)
    {
        node_type* const pNode = (node_type*)allocate_memory(mAllocator, sizeof(node_type), kValueAlignment, kValueAlignmentOffset);

        #if EASTL_EXCEPTIONS_ENABLED
            try
            {
        #endif
                ::new(&pNode->mValue) value_type(value);
                pNode->mpNext = NULL;
                return pNode;
        #if EASTL_EXCEPTIONS_ENABLED
            }
            catch(...)
            {
                EASTLFree(mAllocator, pNode, sizeof(node_type));
                throw;
            }
        #endif
    }